

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O2

int32_t WebRtcIsac_GetDownlinkMaxDelay(BwEstimatorstr *bwest_str)

{
  int32_t iVar1;
  int iVar2;
  
  if ((bwest_str->external_bw_info).in_use == 0) {
    iVar2 = 0x19;
    if ((int)bwest_str->rec_max_delay < 0x19) {
      iVar2 = (int)bwest_str->rec_max_delay;
    }
    iVar1 = 5;
    if (5 < iVar2) {
      iVar1 = iVar2;
    }
    return iVar1;
  }
  __assert_fail("!bwest_str->external_bw_info.in_use",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_coding/codecs/isac/main/source/bandwidth_estimator.c"
                ,0x2e8,"int32_t WebRtcIsac_GetDownlinkMaxDelay(const BwEstimatorstr *)");
}

Assistant:

int32_t
WebRtcIsac_GetDownlinkMaxDelay(const BwEstimatorstr *bwest_str)
{
  int32_t rec_max_delay;

  assert(!bwest_str->external_bw_info.in_use);

  rec_max_delay = (int32_t)(bwest_str->rec_max_delay);

  /* limit range of jitter estimate */
  if (rec_max_delay < MIN_ISAC_MD)
  {
    rec_max_delay = MIN_ISAC_MD;
  }
  else if (rec_max_delay > MAX_ISAC_MD)
  {
    rec_max_delay = MAX_ISAC_MD;
  }
  return rec_max_delay;
}